

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int require_bytes(spng_ctx *ctx,size_t bytes)

{
  ulong uVar1;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
    if ((*(ushort *)&ctx->field_0xcc & 2) == 0) {
      return 0x53;
    }
    uVar4 = bytes + ctx->bytes_encoded;
    if (CARRY8(bytes,ctx->bytes_encoded)) {
      return 3;
    }
    uVar3 = ctx->out_png_size;
    if (uVar4 <= uVar3) {
      return 0;
    }
    uVar1 = 0x4000;
    if (0x4000 < uVar3) {
      uVar1 = uVar3;
    }
    do {
      uVar3 = uVar1;
      uVar1 = uVar3 * 2;
    } while (uVar3 < uVar4);
    puVar2 = (uchar *)(*(ctx->alloc).realloc_fn)(ctx->out_png,uVar3);
    if (puVar2 == (uchar *)0x0) {
LAB_0010a625:
      ctx->state = SPNG_STATE_INVALID;
      return 2;
    }
    ctx->out_png = puVar2;
    ctx->out_png_size = uVar3;
    puVar2 = puVar2 + ctx->bytes_encoded;
  }
  else {
    uVar4 = ctx->stream_buf_size;
    if (bytes <= uVar4) {
      return 0;
    }
    uVar3 = 0x200c;
    if (0x200c < uVar4) {
      uVar3 = uVar4;
    }
    if (0x200c < bytes) {
      uVar3 = bytes;
    }
    puVar2 = (uchar *)(*(ctx->alloc).realloc_fn)(ctx->stream_buf,uVar3);
    if (puVar2 == (uchar *)0x0) goto LAB_0010a625;
    ctx->stream_buf = puVar2;
    ctx->stream_buf_size = bytes;
  }
  ctx->write_ptr = puVar2;
  return 0;
}

Assistant:

static int require_bytes(spng_ctx *ctx, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    if(ctx->streaming)
    {
        if(bytes > ctx->stream_buf_size)
        {
            size_t new_size = ctx->stream_buf_size;

            /* Start at default IDAT size + header + crc */
            if(new_size < (SPNG_WRITE_SIZE + 12)) new_size = SPNG_WRITE_SIZE + 12;

            if(new_size < bytes) new_size = bytes;

            void *temp = spng__realloc(ctx, ctx->stream_buf, new_size);

            if(temp == NULL) return encode_err(ctx, SPNG_EMEM);

            ctx->stream_buf = temp;
            ctx->stream_buf_size = bytes;
            ctx->write_ptr = ctx->stream_buf;
        }

        return 0;
    }

    if(!ctx->internal_buffer) return SPNG_ENODST;

    size_t required = ctx->bytes_encoded + bytes;
    if(required < bytes) return SPNG_EOVERFLOW;

    if(required > ctx->out_png_size)
    {
        size_t new_size = ctx->out_png_size;

        /* Start with a size that doesn't require a realloc() 100% of the time */
        if(new_size < (SPNG_WRITE_SIZE * 2)) new_size = SPNG_WRITE_SIZE * 2;

        /* Prefer the next power of two over the requested size */
        while(new_size < required)
        {
            if(new_size / SIZE_MAX > 2) return encode_err(ctx, SPNG_EOVERFLOW);

            new_size *= 2;
        }

        void *temp = spng__realloc(ctx, ctx->out_png, new_size);

        if(temp == NULL) return encode_err(ctx, SPNG_EMEM);

        ctx->out_png = temp;
        ctx->out_png_size = new_size;
        ctx->write_ptr = ctx->out_png + ctx->bytes_encoded;
    }

    return 0;
}